

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testSerializeNewOrderSingle(int count)

{
  undefined1 *puVar1;
  __time_t _Var2;
  __suseconds_t _Var3;
  timeval tv;
  Symbol symbol;
  ClOrdID clOrdID;
  Side side;
  HandlInst handlInst;
  NewOrderSingle message;
  OrdType ordType;
  TransactTime transactTime;
  long *local_3c8 [2];
  long local_3b8 [2];
  timeval local_3a8;
  undefined1 local_398 [16];
  _Alloc_hider local_388;
  char local_378 [16];
  _Alloc_hider local_368;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  field_metrics local_348;
  undefined1 local_340 [16];
  _Alloc_hider local_330;
  char local_320 [16];
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  field_metrics local_2f0;
  FieldBase local_2e8;
  FieldBase local_290;
  NewOrderSingle local_238;
  FieldBase local_e0;
  FieldBase local_88;
  
  puVar1 = &local_238.super_Message.field_0x10;
  local_238.super_Message._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"ORDERID","");
  local_340._0_8_ = &PTR__FieldBase_0011c4d8;
  local_340._8_4_ = 0xb;
  local_330._M_p = local_320;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,local_238.super_Message._0_8_,
             (undefined1 *)(local_238.super_Message._0_8_ + local_238.super_Message._8_8_));
  local_310._M_p = (pointer)&local_300;
  local_308 = 0;
  local_300._M_local_buf[0] = '\0';
  local_2f0.m_length = 0;
  local_2f0.m_checksum = 0;
  local_340._0_8_ = &PTR__FieldBase_0011c558;
  if ((undefined1 *)local_238.super_Message._0_8_ != puVar1) {
    operator_delete((void *)local_238.super_Message._0_8_,local_238.super_Message._16_8_ + 1);
  }
  FIX::CharField::CharField((CharField *)&local_290,0x15,'1');
  local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c590;
  local_238.super_Message._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"LNUX","");
  local_398._0_8_ = &PTR__FieldBase_0011c4d8;
  local_398._8_4_ = 0x37;
  local_388._M_p = local_378;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,local_238.super_Message._0_8_,
             (undefined1 *)(local_238.super_Message._0_8_ + local_238.super_Message._8_8_));
  local_368._M_p = (pointer)&local_358;
  local_360 = 0;
  local_358._M_local_buf[0] = '\0';
  local_348.m_length = 0;
  local_348.m_checksum = 0;
  local_398._0_8_ = &PTR__FieldBase_0011c600;
  if ((undefined1 *)local_238.super_Message._0_8_ != puVar1) {
    operator_delete((void *)local_238.super_Message._0_8_,local_238.super_Message._16_8_ + 1);
  }
  FIX::CharField::CharField((CharField *)&local_2e8,0x36,'1');
  local_2e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c638;
  FIX::TransactTime::now();
  FIX::CharField::CharField((CharField *)&local_e0,0x28,'1');
  local_e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c6e0;
  FIX42::NewOrderSingle::NewOrderSingle
            (&local_238,(ClOrdID *)local_340,(HandlInst *)&local_290,(Symbol *)local_398,
             (Side *)&local_2e8,(TransactTime *)&local_88,(OrdType *)&local_e0);
  gettimeofday(&local_3a8,(__timezone_ptr_t)0x0);
  _Var3 = local_3a8.tv_usec;
  _Var2 = local_3a8.tv_sec;
  if (0 < count) {
    do {
      FIX::Message::toString_abi_cxx11_((int)local_3c8,(int)&local_238,8);
      if (local_3c8[0] != local_3b8) {
        operator_delete(local_3c8[0],local_3b8[0] + 1);
      }
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_3a8,(__timezone_ptr_t)0x0);
  FIX::Message::~Message((Message *)&local_238);
  FIX::FieldBase::~FieldBase(&local_e0);
  FIX::FieldBase::~FieldBase(&local_88);
  FIX::FieldBase::~FieldBase(&local_2e8);
  FIX::FieldBase::~FieldBase((FieldBase *)local_398);
  FIX::FieldBase::~FieldBase(&local_290);
  FIX::FieldBase::~FieldBase((FieldBase *)local_340);
  return (local_3a8.tv_usec - (_Var3 + (long)((double)_Var2 * 1000000.0))) +
         (long)((double)local_3a8.tv_sec * 1000000.0);
}

Assistant:

long testSerializeNewOrderSingle(int count) {
  FIX::ClOrdID clOrdID("ORDERID");
  FIX::HandlInst handlInst('1');
  FIX::Symbol symbol("LNUX");
  FIX::Side side(FIX::Side_BUY);
  FIX::TransactTime transactTime = FIX::TransactTime::now();
  FIX::OrdType ordType(FIX::OrdType_MARKET);
  FIX42::NewOrderSingle message(clOrdID, handlInst, symbol, side, transactTime, ordType);

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.toString();
  }
  return GetTickCount() - start;
}